

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O0

int __thiscall
ncnn::YoloDetectionOutput::forward_inplace
          (YoloDetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs
          ,Option *opt)

{
  value_type vVar1;
  pointer pBVar2;
  __normal_iterator<const_ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
  __last;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> __last_00;
  __normal_iterator<const_ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
  __first;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> __first_00;
  const_iterator __position;
  const_iterator __position_00;
  bool bVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar4;
  float *pfVar5;
  value_type *pvVar6;
  reference pvVar7;
  size_type sVar8;
  reference this_00;
  reference pvVar9;
  reference pvVar10;
  undefined8 in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *in_RDI;
  float fVar11;
  float fVar12;
  double dVar13;
  float *outptr;
  float score_1;
  BBoxRect *r;
  int i_3;
  Mat *top_blob;
  int num_detected;
  size_t z;
  size_t i_2;
  vector<float,_std::allocator<float>_> bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<float,_std::allocator<float>_> *box_bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *box_bbox_rects;
  int i_1;
  BBoxRect c;
  float confidence;
  float score;
  int q;
  float class_score;
  int class_index;
  float box_score;
  float bbox_ymax;
  float bbox_xmax;
  float bbox_ymin;
  float bbox_xmin;
  float bbox_h;
  float bbox_w;
  float bbox_cy;
  float bbox_cx;
  int j;
  int i;
  Mat scores;
  float *box_score_ptr;
  float *hptr;
  float *wptr;
  float *yptr;
  float *xptr;
  float bias_h;
  float bias_w;
  int p;
  int pp;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  all_box_bbox_scores;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  all_box_bbox_rects;
  int channels_per_box;
  int channels;
  int h;
  int w;
  Mat *bottom_top_blob;
  size_t b;
  vector<float,_std::allocator<float>_> all_bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> all_bbox_rects;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb50;
  int in_stack_fffffffffffffb54;
  Mat *in_stack_fffffffffffffb58;
  value_type *__x;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffb60;
  Mat *in_stack_fffffffffffffb68;
  iterator in_stack_fffffffffffffb70;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb98;
  float in_stack_fffffffffffffb9c;
  float in_stack_fffffffffffffba0;
  float in_stack_fffffffffffffba4;
  float in_stack_fffffffffffffba8;
  float in_stack_fffffffffffffbac;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  *in_stack_fffffffffffffbf0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *picked_00;
  int local_3dc;
  value_type *local_3c0;
  vector<float,_std::allocator<float>_> local_3b8;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> local_3a0;
  vector<float,_std::allocator<float>_> local_388;
  float *local_370;
  float *local_368;
  float *local_360;
  float *local_358;
  BBoxRect *local_348;
  BBoxRect *local_340;
  BBoxRect *local_338;
  BBoxRect *local_330;
  reference local_320;
  reference local_318;
  int local_30c;
  float local_308;
  float local_304;
  float local_300;
  float local_2fc;
  int local_2f8;
  float local_2f4;
  Mat local_2f0;
  float local_2ac;
  int local_2a8;
  float local_2a4;
  int local_2a0;
  float local_29c;
  float local_298;
  float local_294;
  float local_290;
  float local_28c;
  float local_288;
  float local_284;
  float local_280;
  float local_27c;
  int local_278;
  int local_274;
  undefined1 local_270 [64];
  Mat local_230;
  float *local_1f0;
  Mat local_1e8;
  float *local_1a8;
  Mat local_1a0;
  float *local_160;
  Mat local_158;
  float *local_118;
  Mat local_110;
  float *local_d0;
  float local_c4;
  float local_c0;
  int local_bc;
  int local_b8;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_a8;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  local_90;
  undefined4 local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  reference local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_58;
  undefined1 local_50 [56];
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  local_50._48_8_ = in_RDX;
  local_18 = in_RSI;
  std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::vector
            ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)0x1adafc);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x1adb09);
  local_58 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  do {
    fVar11 = (float)((ulong)in_stack_fffffffffffffbf0 >> 0x20);
    picked_00 = local_58;
    pvVar4 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
    if (pvVar4 <= picked_00) {
      qsort_descent_inplace<ncnn::BBoxRect>
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffffb60,
                 (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffb58);
      in_stack_fffffffffffffb60 = &local_388;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1ae6d8);
      nms_sorted_bboxes(in_RDI,picked_00,fVar11);
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::vector
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)0x1ae709);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)0x1ae716);
      local_3c0 = (value_type *)0x0;
      while( true ) {
        __x = local_3c0;
        pvVar6 = (value_type *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_388);
        if (pvVar6 <= __x) break;
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_388,
                            (size_type)local_3c0);
        sVar8 = *pvVar7;
        std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::operator[]
                  ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)(local_50 + 0x18),
                   sVar8);
        std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                  ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                   in_stack_fffffffffffffb60,__x);
        std::vector<float,_std::allocator<float>_>::operator[]
                  ((vector<float,_std::allocator<float>_> *)local_50,sVar8);
        std::vector<float,_std::allocator<float>_>::push_back(in_stack_fffffffffffffb60,&__x->xmin);
        local_3c0 = (value_type *)((long)&local_3c0->xmin + 1);
      }
      sVar8 = std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::size(&local_3a0);
      if ((int)sVar8 == 0) {
        local_4 = 0;
      }
      else {
        this_00 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
        Mat::create((Mat *)in_stack_fffffffffffffb70._M_current,
                    (int)((ulong)in_stack_fffffffffffffb68 >> 0x20),(int)in_stack_fffffffffffffb68,
                    (size_t)in_stack_fffffffffffffb60,(Allocator *)__x);
        bVar3 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
        if (bVar3) {
          local_4 = -100;
        }
        else {
          for (local_3dc = 0; local_3dc < (int)sVar8; local_3dc = local_3dc + 1) {
            pvVar9 = std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::operator[]
                               (&local_3a0,(long)local_3dc);
            pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                                (&local_3b8,(long)local_3dc);
            vVar1 = *pvVar10;
            pfVar5 = Mat::row(this_00,local_3dc);
            *pfVar5 = (float)(pvVar9->label + 1);
            pfVar5[1] = vVar1;
            pfVar5[2] = pvVar9->xmin;
            pfVar5[3] = pvVar9->ymin;
            pfVar5[4] = pvVar9->xmax;
            pfVar5[5] = pvVar9->ymax;
          }
          local_4 = 0;
        }
      }
      local_74 = 1;
      std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffb60);
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~vector
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffffb60);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffb60)
      ;
LAB_001aea74:
      std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffb60);
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~vector
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffffb60);
      return local_4;
    }
    local_60 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                         (local_18,(size_type)local_58);
    local_64 = local_60->w;
    local_68 = local_60->h;
    local_6c = local_60->c;
    local_70 = local_6c /
               *(int *)((long)&in_RDI[7].
                               super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
    if (local_70 !=
        *(int *)&in_RDI[7].super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage + 5) {
      local_4 = -1;
      local_74 = 1;
      goto LAB_001aea74;
    }
    in_stack_fffffffffffffbf0 = &local_90;
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::vector((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
              *)0x1adbfa);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)0x1adc07);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::resize((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
              *)in_stack_fffffffffffffb70._M_current,(size_type)in_stack_fffffffffffffb68);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)in_stack_fffffffffffffb70._M_current,(size_type)in_stack_fffffffffffffb68);
    for (local_b8 = 0;
        local_b8 <
        *(int *)((long)&in_RDI[7].
                        super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 4); local_b8 = local_b8 + 1) {
      local_bc = local_b8 * local_70;
      pfVar5 = Mat::operator[]((Mat *)&in_RDI[8].
                                       super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                       ._M_impl.super__Vector_impl_data._M_finish,
                               (long)(local_b8 * 2));
      local_c0 = *pfVar5;
      pfVar5 = Mat::operator[]((Mat *)&in_RDI[8].
                                       super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                       ._M_impl.super__Vector_impl_data._M_finish,
                               (long)(local_b8 * 2 + 1));
      local_c4 = *pfVar5;
      Mat::channel(in_stack_fffffffffffffb58,in_stack_fffffffffffffb54);
      pfVar5 = Mat::operator_cast_to_float_(&local_110);
      Mat::~Mat((Mat *)0x1add45);
      local_d0 = pfVar5;
      Mat::channel(in_stack_fffffffffffffb58,in_stack_fffffffffffffb54);
      pfVar5 = Mat::operator_cast_to_float_(&local_158);
      Mat::~Mat((Mat *)0x1add99);
      local_118 = pfVar5;
      Mat::channel(in_stack_fffffffffffffb58,in_stack_fffffffffffffb54);
      pfVar5 = Mat::operator_cast_to_float_(&local_1a0);
      Mat::~Mat((Mat *)0x1addee);
      local_160 = pfVar5;
      Mat::channel(in_stack_fffffffffffffb58,in_stack_fffffffffffffb54);
      pfVar5 = Mat::operator_cast_to_float_(&local_1e8);
      Mat::~Mat((Mat *)0x1ade40);
      local_1a8 = pfVar5;
      Mat::channel(in_stack_fffffffffffffb58,in_stack_fffffffffffffb54);
      pfVar5 = Mat::operator_cast_to_float_(&local_230);
      Mat::~Mat((Mat *)0x1ade8f);
      local_1f0 = pfVar5;
      Mat::channel_range(in_stack_fffffffffffffb68,(int)((ulong)in_stack_fffffffffffffb60 >> 0x20),
                         (int)in_stack_fffffffffffffb60);
      pBVar2 = in_RDI[0xb].super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
               _M_impl.super__Vector_impl_data._M_start;
      (**(code **)(*(long *)pBVar2 + 0x48))(pBVar2,local_270,local_50._48_8_);
      for (local_274 = 0; local_274 < local_68; local_274 = local_274 + 1) {
        for (local_278 = 0; local_278 < local_64; local_278 = local_278 + 1) {
          fVar11 = (float)local_278;
          fVar12 = sigmoid(0.0);
          local_27c = (fVar11 + fVar12) / (float)local_64;
          in_stack_fffffffffffffba8 = (float)local_274;
          in_stack_fffffffffffffbac = sigmoid(0.0);
          local_280 = (in_stack_fffffffffffffba8 + in_stack_fffffffffffffbac) / (float)local_68;
          dVar13 = std::exp((double)(ulong)(uint)*local_160);
          in_stack_fffffffffffffba4 = SUB84(dVar13,0);
          local_284 = (in_stack_fffffffffffffba4 * local_c0) / (float)local_64;
          dVar13 = std::exp((double)(ulong)(uint)*local_1a8);
          in_stack_fffffffffffffba0 = SUB84(dVar13,0);
          local_288 = (in_stack_fffffffffffffba0 * local_c4) / (float)local_68;
          local_28c = local_27c - local_284 * 0.5;
          local_290 = local_280 - local_288 * 0.5;
          local_294 = local_27c + local_284 * 0.5;
          local_298 = local_280 + local_288 * 0.5;
          in_stack_fffffffffffffb9c = sigmoid(0.0);
          local_2a0 = 0;
          local_2a4 = 0.0;
          local_29c = in_stack_fffffffffffffb9c;
          for (local_2a8 = 0;
              local_2a8 <
              *(int *)&in_RDI[7].super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage; local_2a8 = local_2a8 + 1
              ) {
            Mat::channel(in_stack_fffffffffffffb58,in_stack_fffffffffffffb54);
            in_stack_fffffffffffffb90 =
                 (vector<float,_std::allocator<float>_> *)Mat::row(&local_2f0,local_274);
            fVar11 = *(float *)((long)&(((_Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                          *)&in_stack_fffffffffffffb90->
                                             super__Vector_base<float,_std::allocator<float>_>)->
                                       _M_impl).super__Vector_impl_data._M_start +
                               (long)local_278 * 4);
            Mat::~Mat((Mat *)0x1ae1aa);
            if (local_2a4 < fVar11) {
              local_2a0 = local_2a8;
              local_2a4 = fVar11;
            }
            local_2ac = fVar11;
          }
          local_2f4 = local_29c * local_2a4;
          if (*(float *)&in_RDI[8].
                         super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl
                         .super__Vector_impl_data._M_start <= local_2f4) {
            local_308 = local_28c;
            local_304 = local_290;
            local_300 = local_294;
            local_2fc = local_298;
            local_2f8 = local_2a0;
            std::
            vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
            ::operator[](&local_90,(long)local_b8);
            std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                      ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                       in_stack_fffffffffffffb60,(value_type *)in_stack_fffffffffffffb58);
            std::
            vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ::operator[](&local_a8,(long)local_b8);
            std::vector<float,_std::allocator<float>_>::push_back
                      (in_stack_fffffffffffffb60,(value_type_conflict4 *)in_stack_fffffffffffffb58);
          }
          local_d0 = local_d0 + 1;
          local_118 = local_118 + 1;
          local_160 = local_160 + 1;
          local_1a8 = local_1a8 + 1;
          local_1f0 = local_1f0 + 1;
        }
      }
      Mat::~Mat((Mat *)0x1ae4a1);
    }
    for (local_30c = 0;
        local_30c <
        *(int *)((long)&in_RDI[7].
                        super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 4); local_30c = local_30c + 1) {
      local_318 = std::
                  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                  ::operator[](&local_90,(long)local_30c);
      local_320 = std::
                  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ::operator[](&local_a8,(long)local_30c);
      local_330 = (BBoxRect *)
                  std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::end
                            ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                             in_stack_fffffffffffffb48);
      __gnu_cxx::
      __normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>
      ::__normal_iterator<ncnn::BBoxRect*>
                ((__normal_iterator<const_ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                 (__normal_iterator<ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
                  *)in_stack_fffffffffffffb48);
      local_338 = (BBoxRect *)
                  std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::begin
                            ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                             in_stack_fffffffffffffb48);
      local_340 = (BBoxRect *)
                  std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::end
                            ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                             in_stack_fffffffffffffb48);
      __position._M_current._4_4_ = in_stack_fffffffffffffbac;
      __position._M_current._0_4_ = in_stack_fffffffffffffba8;
      __first._M_current._4_4_ = in_stack_fffffffffffffba4;
      __first._M_current._0_4_ = in_stack_fffffffffffffba0;
      __last._M_current._4_4_ = in_stack_fffffffffffffb9c;
      __last._M_current._0_4_ = in_stack_fffffffffffffb98;
      local_348 = (BBoxRect *)
                  std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
                  insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>,void>
                            ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                             in_stack_fffffffffffffb90,__position,__first,__last);
      in_stack_fffffffffffffb68 = (Mat *)local_50;
      local_358 = (float *)std::vector<float,_std::allocator<float>_>::end
                                     (in_stack_fffffffffffffb48);
      __gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>::
      __normal_iterator<float*>
                ((__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *)
                 CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                 (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                 in_stack_fffffffffffffb48);
      local_360 = (float *)std::vector<float,_std::allocator<float>_>::begin
                                     (in_stack_fffffffffffffb48);
      local_368 = (float *)std::vector<float,_std::allocator<float>_>::end
                                     (in_stack_fffffffffffffb48);
      __position_00._M_current._4_4_ = in_stack_fffffffffffffbac;
      __position_00._M_current._0_4_ = in_stack_fffffffffffffba8;
      __first_00._M_current._4_4_ = in_stack_fffffffffffffba4;
      __first_00._M_current._0_4_ = in_stack_fffffffffffffba0;
      __last_00._M_current._4_4_ = in_stack_fffffffffffffb9c;
      __last_00._M_current._0_4_ = in_stack_fffffffffffffb98;
      in_stack_fffffffffffffb70 =
           std::vector<float,std::allocator<float>>::
           insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,void>
                     (in_stack_fffffffffffffb90,__position_00,__first_00,__last_00);
      local_370 = in_stack_fffffffffffffb70._M_current;
    }
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               *)in_stack_fffffffffffffb60);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::~vector((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
               *)in_stack_fffffffffffffb60);
    local_58 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&(local_58->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                       ._M_impl.super__Vector_impl_data._M_start + 1);
  } while( true );
}

Assistant:

int YoloDetectionOutput::forward_inplace(std::vector<Mat>& bottom_top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;
    std::vector<float> all_bbox_scores;

    for (size_t b=0; b<bottom_top_blobs.size(); b++)
    {
        Mat& bottom_top_blob = bottom_top_blobs[b];

        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;

        std::vector< std::vector<BBoxRect> > all_box_bbox_rects;
        std::vector< std::vector<float> > all_box_bbox_scores;
        all_box_bbox_rects.resize(num_box);
        all_box_bbox_scores.resize(num_box);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;

            const float bias_w = biases[pp*2];
            const float bias_h = biases[pp*2+1];

            const float* xptr = bottom_top_blob.channel(p);
            const float* yptr = bottom_top_blob.channel(p+1);
            const float* wptr = bottom_top_blob.channel(p+2);
            const float* hptr = bottom_top_blob.channel(p+3);

            const float* box_score_ptr = bottom_top_blob.channel(p+4);

            // softmax class scores
            Mat scores = bottom_top_blob.channel_range(p+5, num_class);
            softmax->forward_inplace(scores, opt);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    // region box
                    float bbox_cx = (j + sigmoid(xptr[0])) / w;
                    float bbox_cy = (i + sigmoid(yptr[0])) / h;
                    float bbox_w = static_cast<float>(exp(wptr[0]) * bias_w / w);
                    float bbox_h = static_cast<float>(exp(hptr[0]) * bias_h / h);

                    float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                    float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                    float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                    float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                    // box score
                    float box_score = sigmoid(box_score_ptr[0]);

                    // find class index with max class score
                    int class_index = 0;
                    float class_score = 0.f;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }

    //                 fprintf(stderr, "%d %f %f\n", class_index, box_score, class_score);

                    float confidence = box_score * class_score;
                    if (confidence >= confidence_threshold)
                    {
                        BBoxRect c = { bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, class_index };
                        all_box_bbox_rects[pp].push_back(c);
                        all_box_bbox_scores[pp].push_back(confidence);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];
            const std::vector<float>& box_bbox_scores = all_box_bbox_scores[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
            all_bbox_scores.insert(all_bbox_scores.end(), box_bbox_scores.begin(), box_bbox_scores.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects, all_bbox_scores);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
        bbox_scores.push_back(all_bbox_scores[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = bottom_top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label + 1);// +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}